

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::anon_unknown_6::protobuf_RegisterTypes(string *param_1)

{
  Descriptor *pDVar1;
  CodeGeneratorRequest *prototype;
  CodeGeneratorResponse *prototype_00;
  CodeGeneratorResponse_File *prototype_01;
  
  protobuf_AssignDescriptorsOnce();
  pDVar1 = (anonymous_namespace)::CodeGeneratorRequest_descriptor_;
  prototype = CodeGeneratorRequest::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype->super_Message);
  pDVar1 = (anonymous_namespace)::CodeGeneratorResponse_descriptor_;
  prototype_00 = CodeGeneratorResponse::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_00->super_Message);
  pDVar1 = (anonymous_namespace)::CodeGeneratorResponse_File_descriptor_;
  prototype_01 = CodeGeneratorResponse_File::default_instance();
  MessageFactory::InternalRegisterGeneratedMessage(pDVar1,&prototype_01->super_Message);
  return;
}

Assistant:

void protobuf_RegisterTypes(const ::std::string&) {
  protobuf_AssignDescriptorsOnce();
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    CodeGeneratorRequest_descriptor_, &CodeGeneratorRequest::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    CodeGeneratorResponse_descriptor_, &CodeGeneratorResponse::default_instance());
  ::google::protobuf::MessageFactory::InternalRegisterGeneratedMessage(
    CodeGeneratorResponse_File_descriptor_, &CodeGeneratorResponse_File::default_instance());
}